

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::ConfigFileClean(cmQtAutoGenInitializer *this,ConfigString *configString)

{
  __node_base *p_Var1;
  
  AddCleanFile(this,&configString->Default);
  if (this->MultiConfig == true) {
    p_Var1 = &(configString->Config)._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      AddCleanFile(this,(string *)(p_Var1 + 5));
    }
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileClean(ConfigString& configString)
{
  this->AddCleanFile(configString.Default);
  if (this->MultiConfig) {
    for (auto const& pair : configString.Config) {
      this->AddCleanFile(pair.second);
    }
  }
}